

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticSeverity.cpp
# Opt level: O2

ostream * psy::operator<<(ostream *os,DiagnosticSeverity severity)

{
  ostream *poVar1;
  int iVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  
  iVar2 = (int)CONCAT71(in_register_00000031,severity);
  if (iVar2 == 2) {
    pcVar3 = "error";
  }
  else {
    if (iVar2 != 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/common/diagnostics/DiagnosticSeverity.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x26);
      std::endl<char,std::char_traits<char>>(poVar1);
      return os;
    }
    pcVar3 = "warning";
  }
  std::operator<<(os,pcVar3);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, DiagnosticSeverity severity)
{
    switch (severity)
    {
        case DiagnosticSeverity::Warning:
            os << "warning";
            break;
        case DiagnosticSeverity::Error:
            os << "error";
            break;
        default:
            PSY_ASSERT_FAIL_1(return os);
    }
    return os;
}